

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

boolean start_timer(level *lev,long when,short kind,short func_index,void *arg)

{
  uint uVar1;
  timer_element *gnu;
  
  if (5 < (ushort)func_index) {
    panic("start_timer");
  }
  gnu = (timer_element *)calloc(1,0x20);
  uVar1 = timer_id + 1;
  gnu->tid = timer_id;
  timer_id = uVar1;
  gnu->timeout = (int)when + moves;
  gnu->kind = kind;
  gnu->func_index = (uchar)func_index;
  gnu->arg = arg;
  insert_timer(lev,gnu);
  if (kind == 2) {
    *(char *)((long)arg + 0x49) = *(char *)((long)arg + 0x49) + '\x01';
  }
  return '\x01';
}

Assistant:

boolean start_timer(struct level *lev, long when, short kind, short func_index,void *arg)
{
    timer_element *gnu;

    if (func_index < 0 || func_index >= NUM_TIME_FUNCS)
	panic("start_timer");

    gnu = malloc(sizeof(timer_element));
    memset(gnu, 0, sizeof(timer_element));
    gnu->next = NULL;
    gnu->tid = timer_id++;
    gnu->timeout = moves + when;
    gnu->kind = kind;
    gnu->needs_fixup = FALSE;
    gnu->func_index = func_index;
    gnu->arg = arg;
    insert_timer(lev, gnu);

    if (kind == TIMER_OBJECT)	/* increment object's timed count */
	((struct obj *)arg)->timed++;

    /* should check for duplicates and fail if any */
    return TRUE;
}